

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fluid.cxx
# Opt level: O0

void shell_pipe_cb(int param_1,void *param_2)

{
  Fl_Text_Display *this;
  int n;
  int iVar1;
  char *pcVar2;
  FILE *__stream;
  char *line_00;
  char local_418 [8];
  char line [1024];
  void *param_1_local;
  int param_0_local;
  
  line._1016_8_ = param_2;
  memset(local_418,0,0x400);
  line_00 = local_418;
  pcVar2 = Fl_Process::get_line(&s_proc,line_00,0x400);
  iVar1 = (int)line_00;
  if (pcVar2 == (char *)0x0) {
    __stream = (FILE *)Fl_Process::desc(&s_proc);
    n = fileno(__stream);
    Fl::remove_fd(n);
    Fl_Process::close(&s_proc,iVar1);
    Fl_Text_Buffer::append(shell_run_buffer,"... END SHELL COMMAND ...\n");
  }
  else {
    Fl_Text_Buffer::append(shell_run_buffer,local_418);
  }
  this = shell_run_display;
  iVar1 = Fl_Text_Buffer::length(shell_run_buffer);
  iVar1 = Fl_Text_Display::count_lines(this,0,iVar1,true);
  Fl_Text_Display::scroll(this,iVar1,0);
  return;
}

Assistant:

void
shell_pipe_cb(FL_SOCKET, void*) {
  char	line[1024]="";		// Line from command output...

  if (s_proc.get_line(line, sizeof(line)) != NULL) {
    // Add the line to the output list...
    shell_run_buffer->append(line);
  } else {
    // End of file; tell the parent...
    Fl::remove_fd(fileno(s_proc.desc()));
    s_proc.close();
    shell_run_buffer->append("... END SHELL COMMAND ...\n");
  }

  shell_run_display->scroll(shell_run_display->count_lines(0,
                            shell_run_buffer->length(), 1), 0);
}